

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_symbolTupleSlotBinding_create
          (sysbvm_context_t *context,sysbvm_tuple_t tupleBinding,sysbvm_tuple_t typeSlot)

{
  sysbvm_object_tuple_t *psVar1;
  sysbvm_tuple_t sVar2;
  
  psVar1 = sysbvm_context_allocatePointerTuple
                     (context,(context->roots).symbolTupleSlotBindingType,9);
  sVar2 = sysbvm_typeSlot_getValidReferenceType(context,typeSlot);
  psVar1[2].header.field_0.typePointer = sVar2;
  psVar1[2].field_1.pointers[0] = 0xb;
  psVar1[3].header.field_0.typePointer = tupleBinding;
  psVar1[3].header.identityHashAndFlags = (int)typeSlot;
  psVar1[3].header.objectSize = (int)(typeSlot >> 0x20);
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_symbolTupleSlotBinding_create(sysbvm_context_t *context, sysbvm_tuple_t tupleBinding, sysbvm_tuple_t typeSlot)
{
    sysbvm_symbolTupleSlotBinding_t *result = (sysbvm_symbolTupleSlotBinding_t*)sysbvm_context_allocatePointerTuple(context, context->roots.symbolTupleSlotBindingType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_symbolTupleSlotBinding_t));
    result->super.super.type = sysbvm_typeSlot_getValidReferenceType(context, typeSlot);
    result->super.vectorIndex = sysbvm_tuple_size_encode(context, 0);
    result->tupleBinding = tupleBinding;
    result->typeSlot = typeSlot;
    return (sysbvm_tuple_t)result;
}